

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeHandlerNoAttr *
Js::PathTypeHandlerNoAttr::New
          (ScriptContext *scriptContext,TypePath *typePath,uint16 pathLength,
          PropertyIndex slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,DynamicType *predecessorType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  PathTypeHandlerNoAttr *this;
  TrackAllocData local_50;
  byte local_22;
  byte local_21;
  uint16 local_20;
  uint16 local_1e;
  PropertyIndex local_1c;
  bool isShared_local;
  bool isLocked_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  PropertyIndex slotCapacity_local;
  uint16 pathLength_local;
  TypePath *typePath_local;
  ScriptContext *scriptContext_local;
  
  local_21 = isLocked;
  local_22 = isShared;
  local_20 = offsetOfInlineSlots;
  local_1e = inlineSlotCapacity;
  local_1c = slotCapacity;
  _isShared_local = pathLength;
  _offsetOfInlineSlots_local = typePath;
  typePath_local = (TypePath *)scriptContext;
  if (typePath == (TypePath *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xdce,"(typePath != nullptr)","typePath != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *(int *)&typePath_local[0x62].data.ptr = *(int *)&typePath_local[0x62].data.ptr + 1;
  pRVar4 = ScriptContext::GetRecycler((ScriptContext *)typePath_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0xdd2);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
  this = (PathTypeHandlerNoAttr *)new<Memory::Recycler>(0x38,pRVar4,0x43c4b0);
  PathTypeHandlerNoAttr
            (this,_offsetOfInlineSlots_local,_isShared_local,local_1c,local_1e,local_20,
             (bool)(local_21 & 1),(bool)(local_22 & 1),predecessorType);
  return this;
}

Assistant:

PathTypeHandlerNoAttr * PathTypeHandlerNoAttr::New(ScriptContext * scriptContext, TypePath* typePath, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType)
    {
        Assert(typePath != nullptr);
#ifdef PROFILE_TYPES
        scriptContext->pathTypeHandlerCount++;
#endif
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeHandlerNoAttr, typePath, pathLength, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, predecessorType);
    }